

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse_square_matrix.h
# Opt level: O3

void __thiscall
sparse_square_matrix<unsigned_char>::recreate(sparse_square_matrix<unsigned_char> *this,uint32_t n)

{
  uint uVar1;
  pointer puVar2;
  
  this->N = n;
  puVar2 = (this->denseStorage).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->denseStorage).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
      .super__Vector_impl_data._M_finish != puVar2) {
    (this->denseStorage).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar2;
  }
  std::
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_unsigned_char>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::clear(&(this->sparseStorage)._M_h);
  uVar1 = this->N;
  if (uVar1 < 0x2000) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              (&this->denseStorage,(ulong)(uVar1 * uVar1));
    return;
  }
  return;
}

Assistant:

void recreate(uint32_t n) {
    N = n;
    denseStorage.clear();
    sparseStorage.clear();
    if (N < DenseLimit) {
      denseStorage.resize(N * N);
    }
  }